

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 local_88 [8];
  FilePath dir;
  size_type local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  __string_type __str;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_88,directory);
    local_48 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_88,dir.pathname_._M_dataplus._M_p + (long)local_88);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (size_type)__str._M_dataplus._M_p,0,1,'/');
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,(relative_path->pathname_)._M_dataplus._M_p,
                       (relative_path->pathname_)._M_string_length);
    dir.pathname_.field_2._8_8_ = (pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dir.pathname_.field_2._8_8_ == paVar3) {
      local_58 = paVar3->_M_allocated_capacity;
      uStack_50 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      dir.pathname_.field_2._8_8_ = &stack0xffffffffffffffa8;
    }
    else {
      local_58 = paVar3->_M_allocated_capacity;
    }
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    FilePath(__return_storage_ptr__,(string *)((long)&dir.pathname_.field_2 + 8));
    if ((size_type *)dir.pathname_.field_2._8_8_ != &stack0xffffffffffffffa8) {
      operator_delete((void *)dir.pathname_.field_2._8_8_,local_58 + 1);
    }
    if (local_48 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)local_48,__str._M_string_length + 1);
    }
    if (local_88 != (undefined1  [8])&dir.pathname_._M_string_length) {
      operator_delete((void *)local_88,dir.pathname_._M_string_length + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}